

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

void __thiscall
ON_DimStyle::OverrideFieldsWithDifferentValues
          (ON_DimStyle *this,ON_DimStyle *source,ON_DimStyle *parent)

{
  bool bVar1;
  ON_SHA1_Hash *a;
  ON_SHA1_Hash *b;
  
  a = ContentHash(source);
  b = ContentHash(parent);
  bVar1 = ::operator==(a,b);
  if (bVar1) {
    SetFieldOverrideAll(this,false);
    return;
  }
  SetFieldOverrideAll(this,true);
  OverrideFields(this,source,parent);
  return;
}

Assistant:

void ON_DimStyle::OverrideFieldsWithDifferentValues(
  const ON_DimStyle& source,
  const ON_DimStyle& parent
)
{
  if (source.ContentHash() == parent.ContentHash())
  {
    SetFieldOverrideAll(false);
  }
  else
  {
    SetFieldOverrideAll(true);
    // OverrideFields() will set to false any fields that have equal property values.
    OverrideFields(source, parent);
  }
}